

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O3

Error __thiscall
asmjit::_abi_1_10::CodeHolder::newSection
          (CodeHolder *this,Section **sectionOut,char *name,size_t nameSize,SectionFlags flags,
          uint32_t alignment,int32_t order)

{
  ZoneAllocator *allocator;
  size_type *psVar1;
  uint uVar2;
  uint *puVar3;
  void *pvVar4;
  Error EVar5;
  int iVar6;
  Section *pSVar7;
  undefined8 *puVar8;
  long lVar9;
  ulong __n;
  FixedString<36UL> *pFVar10;
  FixedString<36UL> *pFVar11;
  ulong extraout_RDX;
  long lVar12;
  FixedString<36UL> *__dest;
  uint uVar13;
  long lVar14;
  size_t local_38;
  
  *sectionOut = (Section *)0x0;
  if (nameSize == 0xffffffffffffffff) {
    nameSize = strlen(name);
  }
  uVar13 = alignment + (alignment == 0);
  if ((uVar13 & uVar13 - 1) == 0) {
    if (0x23 < nameSize) {
      return 0x15;
    }
    uVar2 = (this->_sections).super_ZoneVectorBase._size;
    if (uVar2 == 0xffffffff) {
      return 0x14;
    }
    allocator = &this->_allocator;
    if (((this->_sections).super_ZoneVectorBase._capacity == uVar2) &&
       (EVar5 = ZoneVectorBase::_grow(&(this->_sections).super_ZoneVectorBase,allocator,8,1),
       EVar5 != 0)) {
      return EVar5;
    }
    if (((this->_sectionsByOrder).super_ZoneVectorBase._capacity ==
         (this->_sectionsByOrder).super_ZoneVectorBase._size) &&
       (EVar5 = ZoneVectorBase::_grow(&(this->_sectionsByOrder).super_ZoneVectorBase,allocator,8,1),
       EVar5 != 0)) {
      return EVar5;
    }
    if (allocator->_zone == (Zone *)0x0) {
      newSection();
    }
    else {
      pSVar7 = (Section *)ZoneAllocator::_allocZeroed(allocator,0x68,&local_38);
      if (pSVar7 != (Section *)0x0) {
        pSVar7->_id = uVar2;
        pSVar7->_flags = flags;
        pSVar7->_alignment = uVar13;
        pSVar7->_order = order;
        __dest = &pSVar7->_name;
        memcpy(__dest,name,nameSize);
        puVar8 = (undefined8 *)(this->_sectionsByOrder).super_ZoneVectorBase._data;
        pFVar10 = (FixedString<36UL> *)(ulong)(this->_sectionsByOrder).super_ZoneVectorBase._size;
        if (pFVar10 != (FixedString<36UL> *)0x0) {
          do {
            __dest = (FixedString<36UL> *)((ulong)pFVar10 >> 1);
            puVar3 = (uint *)puVar8[(long)__dest];
            uVar13 = puVar3[3];
            name = (char *)~(ulong)__dest;
            if (((int)uVar13 < order) || (pFVar11 = __dest, (int)uVar13 <= order && *puVar3 < uVar2)
               ) {
              puVar8 = puVar8 + (long)__dest + 1;
              pFVar11 = (FixedString<36UL> *)((long)pFVar10 + (long)name);
            }
            pFVar10 = pFVar11;
          } while (0 < (long)pFVar11);
        }
        uVar13 = (this->_sections).super_ZoneVectorBase._size;
        if (uVar13 < (this->_sections).super_ZoneVectorBase._capacity) {
          *(Section **)((long)(this->_sections).super_ZoneVectorBase._data + (ulong)uVar13 * 8) =
               pSVar7;
          psVar1 = &(this->_sections).super_ZoneVectorBase._size;
          *psVar1 = *psVar1 + 1;
          uVar13 = (this->_sectionsByOrder).super_ZoneVectorBase._size;
          if (uVar13 < (this->_sectionsByOrder).super_ZoneVectorBase._capacity) {
            pvVar4 = (this->_sectionsByOrder).super_ZoneVectorBase._data;
            lVar9 = (long)puVar8 - (long)pvVar4;
            name = (char *)(lVar9 >> 3);
            if (name <= (char *)(ulong)uVar13) {
              memmove((undefined8 *)((long)pvVar4 + lVar9) + 1,(void *)((long)pvVar4 + lVar9),
                      ((long)(ulong)uVar13 - (long)name) * 8);
              *(undefined8 *)((long)pvVar4 + lVar9) = pSVar7;
              psVar1 = &(this->_sectionsByOrder).super_ZoneVectorBase._size;
              *psVar1 = *psVar1 + 1;
              *sectionOut = pSVar7;
              return 0;
            }
            goto LAB_0011838d;
          }
        }
        else {
          newSection();
        }
        newSection();
LAB_0011838d:
        newSection();
        __n = extraout_RDX;
        if (extraout_RDX == 0xffffffffffffffff) {
          __n = strlen(name);
        }
        if ((__n < 0x24) && (uVar13 = __dest[6].u32[0], (ulong)uVar13 != 0)) {
          lVar9 = *(long *)((long)__dest + 0xd0);
          lVar12 = 0;
          do {
            lVar14 = *(long *)(lVar9 + lVar12);
            iVar6 = bcmp((void *)(lVar14 + 0x20),name,__n);
            if ((iVar6 == 0) && (*(char *)(lVar14 + 0x20 + __n) == '\0')) goto LAB_00118407;
            lVar12 = lVar12 + 8;
          } while ((ulong)uVar13 << 3 != lVar12);
        }
        lVar14 = 0;
LAB_00118407:
        return (Error)lVar14;
      }
    }
    EVar5 = 1;
  }
  else {
    EVar5 = 2;
  }
  return EVar5;
}

Assistant:

Error CodeHolder::newSection(Section** sectionOut, const char* name, size_t nameSize, SectionFlags flags, uint32_t alignment, int32_t order) noexcept {
  *sectionOut = nullptr;

  if (nameSize == SIZE_MAX)
    nameSize = strlen(name);

  if (alignment == 0)
    alignment = 1;

  if (ASMJIT_UNLIKELY(!Support::isPowerOf2(alignment)))
    return DebugUtils::errored(kErrorInvalidArgument);

  if (ASMJIT_UNLIKELY(nameSize > Globals::kMaxSectionNameSize))
    return DebugUtils::errored(kErrorInvalidSectionName);

  uint32_t sectionId = _sections.size();
  if (ASMJIT_UNLIKELY(sectionId == Globals::kInvalidId))
    return DebugUtils::errored(kErrorTooManySections);

  ASMJIT_PROPAGATE(_sections.willGrow(&_allocator));
  ASMJIT_PROPAGATE(_sectionsByOrder.willGrow(&_allocator));

  Section* section = _allocator.allocZeroedT<Section>();
  if (ASMJIT_UNLIKELY(!section))
    return DebugUtils::errored(kErrorOutOfMemory);

  section->_id = sectionId;
  section->_flags = flags;
  section->_alignment = alignment;
  section->_order = order;
  memcpy(section->_name.str, name, nameSize);

  Section** insertPosition = std::lower_bound(_sectionsByOrder.begin(), _sectionsByOrder.end(), section, [](const Section* a, const Section* b) {
    return std::make_tuple(a->order(), a->id()) < std::make_tuple(b->order(), b->id());
  });

  _sections.appendUnsafe(section);
  _sectionsByOrder.insertUnsafe((size_t)(insertPosition - _sectionsByOrder.data()), section);

  *sectionOut = section;
  return kErrorOk;
}